

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O2

size_type fs_with_suffix(char *path,char *new_suffix,char *result,size_type buffer_size)

{
  size_t sVar1;
  size_t sVar2;
  size_type sVar3;
  string_view path_00;
  string_view s;
  string_view new_suffix_00;
  string local_50;
  
  sVar1 = strlen(path);
  sVar2 = strlen(new_suffix);
  path_00._M_str = path;
  path_00._M_len = sVar1;
  new_suffix_00._M_str = new_suffix;
  new_suffix_00._M_len = sVar2;
  fs_with_suffix_abi_cxx11_(&local_50,path_00,new_suffix_00);
  s._M_str = local_50._M_dataplus._M_p;
  s._M_len = local_50._M_string_length;
  sVar3 = fs_str2char(s,result,buffer_size);
  std::__cxx11::string::~string((string *)&local_50);
  return sVar3;
}

Assistant:

std::string::size_type fs_with_suffix(const char* path, const char* new_suffix,
                         char* result, const std::string::size_type buffer_size){
  return fs_str2char(fs_with_suffix(path, new_suffix), result, buffer_size);
}